

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

document_iterator __thiscall llvm::yaml::Stream::begin(Stream *this)

{
  Document *this_00;
  undefined1 local_50 [56];
  
  if ((this->CurrentDoc)._M_t.
      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>._M_t.
      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>.
      super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl == (Document *)0x0) {
    yaml::Scanner::getNext
              ((Token *)local_50,
               (this->scanner)._M_t.
               super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
               .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>._M_head_impl);
    std::__cxx11::string::~string((string *)(local_50 + 0x18));
    this_00 = (Document *)operator_new(0xa8);
    Document::Document(this_00,this);
    std::__uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::reset
              ((__uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
               &this->CurrentDoc,this_00);
    return (document_iterator)&this->CurrentDoc;
  }
  report_fatal_error("Can only iterate over the stream once",true);
}

Assistant:

document_iterator Stream::begin() {
  if (CurrentDoc)
    report_fatal_error("Can only iterate over the stream once");

  // Skip Stream-Start.
  scanner->getNext();

  CurrentDoc.reset(new Document(*this));
  return document_iterator(CurrentDoc);
}